

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_sconn_txdatdone(void *arg)

{
  nng_err nVar1;
  nni_aio *aio;
  http_sconn *sc;
  void *arg_local;
  
  nVar1 = nni_aio_result((nni_aio *)((long)arg + 0x5a0));
  if (nVar1 == NNG_OK) {
    if ((*(byte *)((long)arg + 0x30) & 1) == 0) {
      *(undefined8 *)((long)arg + 0x20) = 0;
      nni_http_read_req(*(nni_http_conn **)((long)arg + 0x10),(nni_aio *)((long)arg + 0x210));
    }
    else {
      http_sconn_close((http_sconn *)arg);
    }
  }
  else {
    http_sconn_close((http_sconn *)arg);
  }
  return;
}

Assistant:

static void
http_sconn_txdatdone(void *arg)
{
	http_sconn *sc  = arg;
	nni_aio    *aio = &sc->txdataio;

	if (nni_aio_result(aio) != NNG_OK) {
		http_sconn_close(sc);
		return;
	}

	if (sc->close) {
		http_sconn_close(sc);
		return;
	}

	sc->handler = NULL;
	nni_http_read_req(sc->conn, &sc->rxaio);
}